

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O3

bool __thiscall Json::Reader::decodeNumber(Reader *this,Token *token,Value *decoded)

{
  char cVar1;
  byte bVar2;
  byte *pbVar3;
  ValueHolder VVar4;
  bool bVar5;
  ushort uVar6;
  ulong uVar7;
  ushort uVar8;
  ValueHolder VVar9;
  ValueHolder *this_00;
  ulong uVar10;
  byte *pbVar11;
  ulong uVar12;
  ValueHolder local_c0 [5];
  ValueHolder local_98 [5];
  ValueHolder local_70 [5];
  ValueHolder local_48;
  ushort local_40;
  
  pbVar3 = (byte *)token->end_;
  cVar1 = *token->start_;
  uVar10 = -(ulong)(cVar1 != '-') | 0x8000000000000000;
  pbVar11 = (byte *)(token->start_ + (cVar1 == '-'));
  if (pbVar11 < pbVar3) {
    uVar7 = 0;
    do {
      bVar2 = *pbVar11;
      if ((byte)(bVar2 - 0x3a) < 0xf6) {
LAB_0010cfac:
        bVar5 = decodeDouble(this,token,decoded);
        return bVar5;
      }
      pbVar11 = pbVar11 + 1;
      uVar12 = (ulong)(bVar2 - 0x30);
      if ((uVar10 / 10 <= uVar7) &&
         (((uVar10 / 10 < uVar7 || (pbVar11 != pbVar3)) || (uVar10 % 10 < uVar12))))
      goto LAB_0010cfac;
      uVar7 = uVar12 + uVar7 * 10;
    } while (pbVar11 < pbVar3);
    if ((cVar1 == '-') && (uVar7 == uVar10)) {
      local_40 = *(ushort *)&decoded->field_0x8;
      local_48 = decoded->value_;
      (decoded->value_).int_ = -0x8000000000000000;
      this_00 = &local_48;
      *(ushort *)&decoded->field_0x8 = (local_40 & 0xfe00) + 1;
      local_40 = local_40 & 0x1ff;
      goto LAB_0010cff8;
    }
    if (cVar1 == '-') goto LAB_0010cf98;
    if (uVar7 < 0x80000000) goto LAB_0010cfcf;
    uVar8 = *(ushort *)&decoded->field_0x8;
    local_c0[0] = decoded->value_;
    (decoded->value_).uint_ = uVar7;
    this_00 = local_c0;
    uVar6 = uVar8 & 0xfe00 | 2;
  }
  else {
    uVar7 = 0;
    if (cVar1 == '-') {
LAB_0010cf98:
      uVar8 = *(ushort *)&decoded->field_0x8;
      VVar9 = decoded->value_;
      (decoded->value_).int_ = -uVar7;
      this_00 = local_70;
    }
    else {
LAB_0010cfcf:
      uVar8 = *(ushort *)&decoded->field_0x8;
      VVar9 = decoded->value_;
      (decoded->value_).uint_ = uVar7;
      this_00 = local_98;
    }
    *this_00 = VVar9;
    uVar6 = (uVar8 & 0xfe00) + 1;
  }
  *(ushort *)&decoded->field_0x8 = uVar6;
  *(ushort *)(this_00 + 1) = uVar8 & 0x1ff;
LAB_0010cff8:
  VVar9 = (ValueHolder)decoded->comments_;
  decoded->comments_ = (CommentInfo *)0x0;
  this_00[2] = VVar9;
  VVar9 = (ValueHolder)decoded->start_;
  VVar4 = (ValueHolder)decoded->limit_;
  decoded->start_ = 0;
  decoded->limit_ = 0;
  this_00[3] = VVar9;
  this_00[4] = VVar4;
  Value::~Value((Value *)this_00);
  return true;
}

Assistant:

bool Reader::decodeNumber(Token& token, Value& decoded) {
  // Attempts to parse the number as an integer. If the number is
  // larger than the maximum supported value of an integer then
  // we decode the number as a double.
  Location current = token.start_;
  bool isNegative = *current == '-';
  if (isNegative)
    ++current;
  // TODO: Help the compiler do the div and mod at compile time or get rid of them.
  Value::LargestUInt maxIntegerValue =
      isNegative ? Value::LargestUInt(Value::maxLargestInt) + 1
                 : Value::maxLargestUInt;
  Value::LargestUInt threshold = maxIntegerValue / 10;
  Value::LargestUInt value = 0;
  while (current < token.end_) {
    Char c = *current++;
    if (c < '0' || c > '9')
      return decodeDouble(token, decoded);
    Value::UInt digit(static_cast<Value::UInt>(c - '0'));
    if (value >= threshold) {
      // We've hit or exceeded the max value divided by 10 (rounded down). If
      // a) we've only just touched the limit, b) this is the last digit, and
      // c) it's small enough to fit in that rounding delta, we're okay.
      // Otherwise treat this number as a double to avoid overflow.
      if (value > threshold || current != token.end_ ||
          digit > maxIntegerValue % 10) {
        return decodeDouble(token, decoded);
      }
    }
    value = value * 10 + digit;
  }
  if (isNegative && value == maxIntegerValue)
    decoded = Value::minLargestInt;
  else if (isNegative)
    decoded = -Value::LargestInt(value);
  else if (value <= Value::LargestUInt(Value::maxInt))
    decoded = Value::LargestInt(value);
  else
    decoded = value;
  return true;
}